

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

void __thiscall sing::HttpResponse::makeResponse(HttpResponse *this,HttpStatusCode code,bool close)

{
  string *__lhs;
  uint uVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this->closeConn = close;
  this->code = code;
  local_90._M_dataplus._M_p._0_4_ = code;
  cVar4 = std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&statusCode2Message_abi_cxx11_._M_t,(key_type *)&local_90);
  if ((_Rb_tree_header *)cVar4._M_node ==
      &statusCode2Message_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    this->code = Code400_BadRequest;
LAB_001100e4:
    makeErrorResponse(this,&this->statusMessage);
    return;
  }
  if (this->code != Code200_Ok) goto LAB_001100e4;
  if ((this->path)._M_string_length != 0) {
    __lhs = &this->path;
    bVar2 = std::operator==(__lhs,"/");
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"/index.html",&local_69);
    }
    else {
      std::__cxx11::string::string((string *)&local_90,(string *)__lhs);
    }
    std::__cxx11::string::operator=((string *)__lhs,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::operator+(&local_90,&this->srcDir,__lhs);
    iVar3 = stat((char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                  (HttpStatusCode)local_90._M_dataplus._M_p),
                 (stat *)&this->mmFileStat);
    if (iVar3 < 0) {
      std::__cxx11::string::~string((string *)&local_90);
LAB_001101ab:
      this->code = Code404_NotFound;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"File Not Found",(allocator<char> *)&local_68);
      makeErrorResponse(this,&local_90);
    }
    else {
      uVar1 = (this->mmFileStat).st_mode;
      std::__cxx11::string::~string((string *)&local_90);
      if ((uVar1 & 0xf000) == 0x4000) goto LAB_001101ab;
      if (((this->mmFileStat).st_mode & 4) == 0) {
        this->code = Code403_Forbidden;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"Access Denied",(allocator<char> *)&local_68);
        makeErrorResponse(this,&local_90);
      }
      else {
        std::operator+(&local_90,&this->srcDir,__lhs);
        iVar3 = open((char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                      (HttpStatusCode)local_90._M_dataplus._M_p),0);
        std::__cxx11::string::~string((string *)&local_90);
        if (iVar3 < 0) {
          this->code = Code404_NotFound;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"File Not Found1",(allocator<char> *)&local_68);
          makeErrorResponse(this,&local_90);
        }
        else {
          pcVar6 = (char *)mmap((void *)0x0,(this->mmFileStat).st_size,1,2,iVar3,0);
          if (pcVar6 == (char *)0xffffffffffffffff) {
            this->code = Code404_NotFound;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_90,"File Not Found2",(allocator<char> *)&local_68);
            makeErrorResponse(this,&local_90);
            this_00 = &local_90;
            goto LAB_00110219;
          }
          this->mmFile = pcVar6;
          ::close(iVar3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"Content-Type",&local_91);
          getFileType_abi_cxx11_(&local_68,this);
          addHeader(this,&local_90,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"Content-Length",&local_91);
          std::__cxx11::to_string(&local_68,(this->mmFileStat).st_size);
          addHeader(this,&local_90,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_90);
  }
  local_90._M_dataplus._M_p._0_4_ = this->code;
  pmVar5 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&statusCode2Message_abi_cxx11_,(key_type *)&local_90);
  std::__cxx11::string::string((string *)&local_48,(string *)pmVar5);
  std::__cxx11::string::_M_assign((string *)&this->statusMessage);
  this_00 = &local_48;
LAB_00110219:
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void HttpResponse::makeResponse(HttpStatusCode code, bool close){
    //set keep alive
    closeConn = close;

    //set code
    setStatusCode(code);
    auto it = statusCode2Message.find(code);
    if(it==statusCode2Message.end()){
        setStatusCode(Code400_BadRequest);
    }

    //----------------do err response-----------------------//
    if(this->code!=Code200_Ok){
        makeErrorResponse(statusMessage);
        return;
    }

    //----------------do static request---------------------//
    if(!path.empty()){
        path = path=="/"?"/index.html":path;
        // if(path=="/"){
        //     body = "Sing Welcome!";
        //     addHeader("Content-length", std::to_string(body.size()));
        //     addHeader("Content-type", "text/html");
        // }
        /* 判断请求的资源文件 */
        if(stat((srcDir + path).data(), &mmFileStat) < 0 || S_ISDIR(mmFileStat.st_mode)) {
            setStatusCode(Code404_NotFound);
            makeErrorResponse("File Not Found");
        }
        else if(!(mmFileStat.st_mode & S_IROTH)) {
            setStatusCode(Code403_Forbidden);
            makeErrorResponse("Access Denied");
        }
        else { 
            int srcFd = open((srcDir + path).data(), O_RDONLY);
            if(srcFd < 0) {
                setStatusCode(Code404_NotFound);
                makeErrorResponse("File Not Found1");
            }else{
                /* 将文件映射到内存提高文件的访问速度 MAP_PRIVATE 建立一个写入时拷贝的私有映射*/
                void* mmRet = mmap(0, (size_t)mmFileStat.st_size, PROT_READ, MAP_PRIVATE, srcFd, 0);
                if(mmRet == (void*)-1) {
                    setStatusCode(Code404_NotFound);
                    makeErrorResponse("File Not Found2");
                    return; 
                }
                mmFile = static_cast<char*>(mmRet);
                ::close(srcFd);

                addHeader("Content-Type", getFileType());
                addHeader("Content-Length", std::to_string(mmFileStat.st_size));
            }
        }
    }

    setStatusMessage(statusCode2Message.at(this->code));

}